

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O3

int __thiscall HevcUnitWithProfile::profile_tier_level(HevcUnitWithProfile *this,int subLayers)

{
  BitStreamReader *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  bool sub_layer_level_present_flag [7];
  bool sub_layer_profile_present_flag [7];
  char local_38 [8];
  char acStack_30 [8];
  
  acStack_30[4] = '\0';
  acStack_30[5] = '\0';
  acStack_30[6] = '\0';
  acStack_30[0] = '\0';
  acStack_30[1] = '\0';
  acStack_30[2] = '\0';
  acStack_30[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  this_00 = &(this->super_HevcUnit).m_reader;
  BitStreamReader::skipBits(this_00,3);
  uVar2 = BitStreamReader::getBits(this_00,5);
  this->profile_idc = (uint8_t)uVar2;
  BitStreamReader::skipBits(this_00,0x20);
  BitStreamReader::skipBit(this_00);
  bVar1 = BitStreamReader::getBit(this_00);
  this->interlaced_source_flag = bVar1;
  BitStreamReader::skipBits(this_00,0x20);
  BitStreamReader::skipBits(this_00,0xe);
  uVar2 = BitStreamReader::getBits(this_00,8);
  this->level_idc = (uint8_t)uVar2;
  if (1 < subLayers) {
    uVar4 = 0;
    do {
      bVar1 = BitStreamReader::getBit(this_00);
      acStack_30[uVar4] = bVar1;
      bVar1 = BitStreamReader::getBit(this_00);
      local_38[uVar4] = bVar1;
      uVar4 = uVar4 + 1;
    } while (subLayers - 1 != uVar4);
    if (subLayers - 2U < 7) {
      iVar3 = subLayers + -9;
      do {
        BitStreamReader::skipBits(this_00,2);
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0);
    }
    if (1 < subLayers) {
      uVar4 = 0;
      do {
        if (acStack_30[uVar4] == '\x01') {
          BitStreamReader::skipBits(this_00,0x20);
          BitStreamReader::skipBits(this_00,0x20);
          BitStreamReader::skipBits(this_00,0x18);
        }
        if (local_38[uVar4] == '\x01') {
          BitStreamReader::skipBits(this_00,8);
        }
        uVar4 = uVar4 + 1;
      } while (subLayers - 1 != uVar4);
    }
  }
  return 0;
}

Assistant:

int HevcUnitWithProfile::profile_tier_level(const int subLayers)
{
    try
    {
        bool sub_layer_profile_present_flag[7]{false};
        bool sub_layer_level_present_flag[7]{false};

        m_reader.skipBits(3);  // profile_space, tier_flag
        profile_idc = m_reader.getBits<uint8_t>(5);
        m_reader.skipBits(32);  // general_profile_compatibility_flag
        m_reader.skipBit();     // progressive_source_flag
        interlaced_source_flag = m_reader.getBit();
        m_reader.skipBits(32);  // unused flags
        m_reader.skipBits(14);  // unused flags
        level_idc = m_reader.getBits<uint8_t>(8);

        for (int i = 0; i < subLayers - 1; i++)
        {
            sub_layer_profile_present_flag[i] = m_reader.getBit();
            sub_layer_level_present_flag[i] = m_reader.getBit();
        }
        if (subLayers > 1)
        {
            for (int i = subLayers - 1; i < 8; i++) m_reader.skipBits(2);  // reserved_zero_2bits
        }

        for (int i = 0; i < subLayers - 1; i++)
        {
            if (sub_layer_profile_present_flag[i])
            {
                m_reader.skipBits(32);  // unused flags
                m_reader.skipBits(32);  // unused flags
                m_reader.skipBits(24);  // unused flags
            }
            if (sub_layer_level_present_flag[i])
                m_reader.skipBits(8);  // sub_layer_level_idc[ i ]
        }
        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}